

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O0

void PaUtil_Set2ndNonInterleavedInputChannel(PaUtilBufferProcessor *bp,uint channel,void *data)

{
  void *data_local;
  uint channel_local;
  PaUtilBufferProcessor *bp_local;
  
  if (bp->inputChannelCount <= channel) {
    __assert_fail("channel < bp->inputChannelCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/common/pa_process.c"
                  ,0x224,
                  "void PaUtil_Set2ndNonInterleavedInputChannel(PaUtilBufferProcessor *, unsigned int, void *)"
                 );
  }
  if (bp->hostInputIsInterleaved == 0) {
    bp->hostInputChannels[1][channel].data = data;
    bp->hostInputChannels[1][channel].stride = 1;
    return;
  }
  __assert_fail("!bp->hostInputIsInterleaved",
                "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/common/pa_process.c"
                ,0x225,
                "void PaUtil_Set2ndNonInterleavedInputChannel(PaUtilBufferProcessor *, unsigned int, void *)"
               );
}

Assistant:

void PaUtil_Set2ndNonInterleavedInputChannel( PaUtilBufferProcessor* bp,
        unsigned int channel, void *data )
{
    assert( channel < bp->inputChannelCount );
    assert( !bp->hostInputIsInterleaved );
    
    bp->hostInputChannels[1][channel].data = data;
    bp->hostInputChannels[1][channel].stride = 1;
}